

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_serializer.cc
# Opt level: O1

void prometheus::(anonymous_namespace)::WriteHead<std::__cxx11::string>
               (ostream *out,MetricFamily *family,ClientMetric *metric,string *suffix,
               string *extraLabelName,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraLabelValue)

{
  pointer pLVar1;
  ostream *poVar2;
  size_t sVar3;
  char *__s;
  char *__s_00;
  Label *lp;
  pointer pLVar4;
  
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(family->name)._M_dataplus._M_p,(family->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(suffix->_M_dataplus)._M_p,suffix->_M_string_length);
  if (((metric->label).
       super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (metric->label).
       super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
       ._M_impl.super__Vector_impl_data._M_finish) || (extraLabelName->_M_string_length != 0)) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"{",1);
    pLVar4 = (metric->label).
             super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pLVar1 = (metric->label).
             super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pLVar4 == pLVar1) {
      __s_00 = "";
    }
    else {
      __s_00 = ",";
      __s = "";
      do {
        sVar3 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(out,__s,sVar3);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,(pLVar4->name)._M_dataplus._M_p,(pLVar4->name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"=\"",2);
        anon_unknown_3::WriteValue(out,&pLVar4->value);
        std::__ostream_insert<char,std::char_traits<char>>(out,"\"",1);
        pLVar4 = pLVar4 + 1;
        __s = __s_00;
      } while (pLVar4 != pLVar1);
    }
    if (extraLabelName->_M_string_length != 0) {
      sVar3 = strlen(__s_00);
      std::__ostream_insert<char,std::char_traits<char>>(out,__s_00,sVar3);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,(extraLabelName->_M_dataplus)._M_p,extraLabelName->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"=\"",2);
      anon_unknown_3::WriteValue(out,extraLabelValue);
      std::__ostream_insert<char,std::char_traits<char>>(out,"\"",1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"}",1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
  return;
}

Assistant:

void WriteHead(std::ostream& out, const MetricFamily& family,
               const ClientMetric& metric, const std::string& suffix = "",
               const std::string& extraLabelName = "",
               const T& extraLabelValue = T()) {
  out << family.name << suffix;
  if (!metric.label.empty() || !extraLabelName.empty()) {
    out << "{";
    const char* prefix = "";

    for (auto& lp : metric.label) {
      out << prefix << lp.name << "=\"";
      WriteValue(out, lp.value);
      out << "\"";
      prefix = ",";
    }
    if (!extraLabelName.empty()) {
      out << prefix << extraLabelName << "=\"";
      WriteValue(out, extraLabelValue);
      out << "\"";
    }
    out << "}";
  }
  out << " ";
}